

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O1

Kind llbuild::buildsystem::BuildKey::kindForIdentifier(char identifier)

{
  undefined3 in_register_00000039;
  int iVar1;
  
  iVar1 = CONCAT31(in_register_00000039,identifier);
  if (iVar1 < 0x53) {
    if (iVar1 < 0x49) {
      if (iVar1 == 0x43) {
        return Command;
      }
      if (iVar1 == 0x44) {
        return DirectoryContents;
      }
    }
    else {
      if (iVar1 == 0x49) {
        return Stat;
      }
      if (iVar1 == 0x4e) {
        return Node;
      }
    }
  }
  else if (iVar1 < 0x58) {
    if (iVar1 == 0x53) {
      return DirectoryTreeSignature;
    }
    if (iVar1 == 0x54) {
      return Target;
    }
  }
  else {
    if (iVar1 == 0x58) {
      return CustomTask;
    }
    if (iVar1 == 100) {
      return FilteredDirectoryContents;
    }
    if (iVar1 == 0x73) {
      return DirectoryTreeStructureSignature;
    }
  }
  return Unknown;
}

Assistant:

static Kind kindForIdentifier(char identifier) {
    switch (identifier) {
    case 'C': return Kind::Command;
    case 'D': return Kind::DirectoryContents;
    case 'd': return Kind::FilteredDirectoryContents;
    case 'N': return Kind::Node;
    case 'I': return Kind::Stat;
    case 'S': return Kind::DirectoryTreeSignature;
    case 's': return Kind::DirectoryTreeStructureSignature;
    case 'T': return Kind::Target;
    case 'X': return Kind::CustomTask;
    default:
      return Kind::Unknown;
    }
  }